

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

SQObject __thiscall SQCompiler::Expect(SQCompiler *this,SQInteger tok)

{
  SQObjectType SVar1;
  SQObjectValue SVar2;
  SQChar *pSVar3;
  SQObject SVar4;
  SQObjectPtr ret;
  SQObject local_20;
  
  if (this->_token != tok) {
    if (tok != 0x102 || this->_token != 0x136) {
      if (0xff < tok) {
        if (tok - 0x102U < 4) {
          pSVar3 = &DAT_0012edd4 + *(int *)(&DAT_0012edd4 + (tok - 0x102U) * 4);
        }
        else {
          pSVar3 = SQLexer::Tok2Str(&this->_lex,tok);
        }
        Error(this,"expected \'%s\'",pSVar3);
      }
      Error(this,"expected \'%c\'",tok);
      goto LAB_0011c821;
    }
switchD_0011c84e_caseD_102:
    ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
    ret.super_SQObject._type = OT_NULL;
    SVar4 = SQFuncState::CreateString(this->_fs,(this->_lex)._svalue,-1);
    local_20._unVal = SVar4._unVal;
    local_20._type = SVar4._type;
    SQObjectPtr::operator=(&ret,&local_20);
    goto switchD_0011c84e_default;
  }
LAB_0011c821:
  ret.super_SQObject._type = OT_NULL;
  ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
  switch(tok) {
  case 0x102:
    goto switchD_0011c84e_caseD_102;
  case 0x103:
    SVar4 = SQFuncState::CreateString
                      (this->_fs,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
    local_20._unVal = SVar4._unVal;
    local_20._type = SVar4._type;
    SQObjectPtr::operator=(&ret,&local_20);
    goto switchD_0011c84e_default;
  case 0x104:
    local_20._unVal = (SQObjectValue)(this->_lex)._nvalue;
    local_20._type = OT_INTEGER;
    SQObjectPtr::operator=(&ret,(SQObjectPtr *)&local_20);
    break;
  case 0x105:
    local_20._type = OT_FLOAT;
    local_20._unVal.nInteger._4_4_ = 0;
    local_20._unVal.fFloat = (this->_lex)._fvalue;
    SQObjectPtr::operator=(&ret,(SQObjectPtr *)&local_20);
    break;
  default:
    goto switchD_0011c84e_default;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_20);
switchD_0011c84e_default:
  Lex(this);
  SVar2 = ret.super_SQObject._unVal;
  SVar1 = ret.super_SQObject._type;
  SQObjectPtr::~SQObjectPtr(&ret);
  SVar4._4_4_ = 0;
  SVar4._type = SVar1;
  SVar4._unVal.pTable = SVar2.pTable;
  return SVar4;
}

Assistant:

SQObject Expect(SQInteger tok)
    {

        if(_token != tok) {
            if(_token == TK_CONSTRUCTOR && tok == TK_IDENTIFIER) {
                //do nothing
            }
            else {
                const SQChar *etypename;
                if(tok > 255) {
                    switch(tok)
                    {
                    case TK_IDENTIFIER:
                        etypename = _SC("IDENTIFIER");
                        break;
                    case TK_STRING_LITERAL:
                        etypename = _SC("STRING_LITERAL");
                        break;
                    case TK_INTEGER:
                        etypename = _SC("INTEGER");
                        break;
                    case TK_FLOAT:
                        etypename = _SC("FLOAT");
                        break;
                    default:
                        etypename = _lex.Tok2Str(tok);
                    }
                    Error(_SC("expected '%s'"), etypename);
                }
                Error(_SC("expected '%c'"), tok);
            }
        }
        SQObjectPtr ret;
        switch(tok)
        {
        case TK_IDENTIFIER:
            ret = _fs->CreateString(_lex._svalue);
            break;
        case TK_STRING_LITERAL:
            ret = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
            break;
        case TK_INTEGER:
            ret = SQObjectPtr(_lex._nvalue);
            break;
        case TK_FLOAT:
            ret = SQObjectPtr(_lex._fvalue);
            break;
        }
        Lex();
        return ret;
    }